

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font_to_svg.hpp
# Opt level: O3

string * __thiscall font2svg::glyph::axes_abi_cxx11_(string *__return_storage_ptr__,glyph *this)

{
  undefined1 *this_00;
  ostream *poVar1;
  long *local_50 [2];
  long local_40 [2];
  
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"");
  std::__cxx11::stringbuf::str((string *)&this->field_0x278);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  this_00 = &this->field_0x270;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"\n\n  <!-- draw axes --> ",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"\n <path stroke=\'blue\' stroke-dasharray=\'5,5\' d=\'",0x30);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," M",2);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)this_00,-this->bbwidth);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," L",2);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->bbwidth);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," M",2);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,-this->bbheight);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," L",2);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->bbheight);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," \'/>",4);
  std::__cxx11::stringbuf::str();
  return __return_storage_ptr__;
}

Assistant:

std::string axes()  {
		tmp.str("");
		tmp << "\n\n  <!-- draw axes --> ";
		tmp << "\n <path stroke='blue' stroke-dasharray='5,5' d='"
			<< " M" << -bbwidth << "," << 0
			<< " L" <<  bbwidth << "," << 0
			<< " M" << 0 << "," << -bbheight
			<< " L" << 0 << "," << bbheight
			<< " '/>";
		return tmp.str();
	}